

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O3

err_t cmdRngStart(bool_t verbose)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  size_t sVar4;
  tm_ticks_t *data;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  tm_ticks_t *state;
  size_t read;
  size_t local_38;
  
  bVar1 = rngIsValid();
  if (bVar1 != 0) {
    return 0;
  }
  if (verbose != 0) {
    printf("Starting RNG[");
    lVar5 = 0;
    lVar6 = 0;
    do {
      eVar2 = rngESRead(&local_38,(void *)0x0,0,
                        *(char **)((long)&PTR_anon_var_dwarf_4b55_0014e860 + lVar5));
      lVar7 = lVar6;
      if (eVar2 == 0) {
        lVar7 = lVar6 + 1;
        pcVar8 = ", %s";
        if (lVar6 == 0) {
          pcVar8 = "%s";
        }
        printf(pcVar8);
      }
      lVar5 = lVar5 + 8;
      lVar6 = lVar7;
    } while (lVar5 != 0x28);
    printf("]... ");
  }
  eVar2 = rngESHealth();
  if (eVar2 == 0x12f) {
    sVar3 = beltHash_keep();
    sVar4 = prngEcho_keep();
    if (sVar4 < sVar3) {
      sVar3 = beltHash_keep();
    }
    else {
      sVar3 = prngEcho_keep();
    }
    data = (tm_ticks_t *)blobCreate(sVar3 + 0x400);
    if (data == (tm_ticks_t *)0x0) {
      return 0x6e;
    }
    eVar2 = cmdRngKbRead(data);
    if (eVar2 != 0) {
      blobClose(data);
      return eVar2;
    }
    state = data + 0x80;
    beltHashStart(state);
    beltHashStepH(data,0x400,state);
    beltHashStepG((octet *)data,state);
    prngEchoStart(state,data,0x20);
    eVar2 = rngCreate(prngEchoRead,state);
    blobClose(data);
  }
  else if (eVar2 == 0) {
    eVar2 = rngCreate((read_i)0x0,(void *)0x0);
  }
  if (verbose != 0) {
    pcVar8 = errMsg(eVar2);
    puts(pcVar8);
  }
  return eVar2;
}

Assistant:

err_t cmdRngStart(bool_t verbose)
{
	err_t code;
	// ГСЧ уже запущен?
	if (rngIsValid())
		return ERR_OK;
	// печать информации об источниках
	if (verbose)
	{
		const char* sources[] = { "trng", "trng2", "sys", "sys2", "timer" };
		size_t pos;
		size_t count;
		size_t read;
		printf("Starting RNG[");
		for (pos = count = 0; pos < COUNT_OF(sources); ++pos)
			if (rngESRead(&read, 0, 0, sources[pos]) == ERR_OK)
				printf(count++ ? ", %s" : "%s", sources[pos]);
		printf("]... ");
	}
	// энтропии достаточно?
	code = rngESHealth();
	if (code == ERR_OK)
		code = rngCreate(0, 0);
	// нет, подключить клавиатурный источник
	else if (code == ERR_NOT_ENOUGH_ENTROPY)
	{
		void* stack;
		tm_ticks_t* data;
		octet* hash;
		void* state;
		// выделить и разметить память
		code = cmdBlobCreate(stack, 128 * sizeof(tm_ticks_t) +
			MAX2(beltHash_keep(), prngEcho_keep()));
		ERR_CALL_CHECK(code);
		data = (tm_ticks_t*)stack;
		hash = (octet*)data;
		state = data + 128;
		// собрать данные от клавиатурного источника
		code = cmdRngKbRead(data);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// хэшировать
		beltHashStart(state);
		beltHashStepH(data, 128 * sizeof(tm_ticks_t), state);
		beltHashStepG(hash, state);
		// запустить echo-генератор
		prngEchoStart(state, hash, 32);
		// запустить генератор
		code = rngCreate(prngEchoRead, state);
		// освободить память
		cmdBlobClose(stack);
	}
	if (verbose)
		printf("%s\n", errMsg(code));
	return code;
}